

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
* get_1d_sincos_pos_embed_from_grid_new
            (int embed_dim,
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *pos)

{
  float fVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_RDX;
  int in_ESI;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  *in_RDI;
  value_type vVar8;
  __type_conflict _Var9;
  double dVar10;
  float out_value;
  int d;
  int w;
  int h;
  int i;
  vector<float,_std::allocator<float>_> omega;
  int W;
  int H;
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  *emb;
  float in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  value_type in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  size_type in_stack_fffffffffffffef8;
  undefined1 *__n;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff00;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *this;
  int local_98;
  int local_94;
  int local_90;
  undefined1 local_8b;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_8a [2];
  undefined1 local_51;
  int local_50;
  vector<float,_std::allocator<float>_> local_38;
  int local_20;
  int local_1c;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  sVar2 = std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::size(in_RDX);
  local_1c = (int)sVar2;
  pvVar3 = std::
           vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ::operator[](local_18,0);
  sVar2 = std::vector<float,_std::allocator<float>_>::size(pvVar3);
  local_20 = (int)sVar2;
  std::allocator<float>::allocator((allocator<float> *)0x1bbf8b);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  std::allocator<float>::~allocator((allocator<float> *)0x1bbfb4);
  local_98 = in_stack_fffffffffffffef4;
  for (local_50 = 0; local_50 < local_c / 2; local_50 = local_50 + 1) {
    _Var9 = std::pow<double,float>
                      ((double)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffedc);
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,(long)local_50);
    *pvVar4 = (float)(1.0 / _Var9);
  }
  local_51 = 0;
  std::allocator<float>::allocator((allocator<float> *)0x1bc0ee);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (allocator_type *)CONCAT44(local_98,in_stack_fffffffffffffef0));
  this = local_8a;
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x1bc119);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(this,in_stack_fffffffffffffef8,(value_type *)CONCAT44(local_98,in_stack_fffffffffffffef0)
           ,(allocator_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  __n = &local_8b;
  std::
  allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
  ::allocator((allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
               *)0x1bc14c);
  std::
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
            *)this,(size_type)__n,(value_type *)CONCAT44(local_98,in_stack_fffffffffffffef0),
           (allocator_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  std::
  allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                *)0x1bc177);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)CONCAT44(local_98,in_stack_fffffffffffffef0));
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x1bc191);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)CONCAT44(local_98,in_stack_fffffffffffffef0));
  std::allocator<float>::~allocator((allocator<float> *)0x1bc1ab);
  for (local_90 = 0; local_90 < local_1c; local_90 = local_90 + 1) {
    for (local_94 = 0; local_94 < local_20; local_94 = local_94 + 1) {
      for (local_98 = 0; local_98 < local_c / 2; local_98 = local_98 + 1) {
        pvVar3 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[](local_18,(long)local_90);
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar3,(long)local_94);
        vVar8 = *pvVar5;
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,(long)local_98);
        fVar1 = *pvVar4;
        dVar10 = std::sin((double)(ulong)(uint)(vVar8 * fVar1));
        in_stack_fffffffffffffef0 = SUB84(dVar10,0);
        pvVar6 = std::
                 vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                 ::operator[](in_RDI,(long)local_90);
        pvVar7 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[](pvVar6,(long)local_94);
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](pvVar7,(long)local_98);
        *pvVar4 = in_stack_fffffffffffffef0;
        dVar10 = std::cos((double)(ulong)(uint)(vVar8 * fVar1));
        vVar8 = SUB84(dVar10,0);
        pvVar6 = std::
                 vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                 ::operator[](in_RDI,(long)local_90);
        pvVar7 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[](pvVar6,(long)local_94);
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                           (pvVar7,(long)(local_98 + local_c / 2));
        *pvVar4 = vVar8;
      }
    }
  }
  local_51 = 1;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)CONCAT44(local_98,in_stack_fffffffffffffef0));
  return in_RDI;
}

Assistant:

static std::vector<std::vector<std::vector<float>>> get_1d_sincos_pos_embed_from_grid_new(int embed_dim, const std::vector<std::vector<float>> & pos) {
    assert(embed_dim % 2 == 0);
    int H = pos.size();
    int W = pos[0].size();

    std::vector<float> omega(embed_dim / 2);
    for (int i = 0; i < embed_dim / 2; ++i) {
        omega[i] = 1.0 / pow(10000.0, static_cast<float>(i) / (embed_dim / 2));
    }

    std::vector<std::vector<std::vector<float>>> emb(H, std::vector<std::vector<float>>(W, std::vector<float>(embed_dim)));
    for (int h = 0; h < H; ++h) {
        for (int w = 0; w < W; ++w) {
            for (int d = 0; d < embed_dim / 2; ++d) {
                float out_value = pos[h][w] * omega[d];
                emb[h][w][d] = sin(out_value);
                emb[h][w][d + embed_dim / 2] = cos(out_value);
            }
        }
    }

    return emb;
}